

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::ProcessBlock
          (PeerManagerImpl *this,CNode *node,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked)

{
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar1;
  ulong extraout_RDX;
  long in_FS_OFFSET;
  optional<long> from_peer;
  bool new_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock73;
  bool local_59;
  unique_lock<std::recursive_mutex> local_58;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = false;
  ChainstateManager::ProcessNewBlock
            (this->m_chainman,block,force_processing,min_pow_checked,&local_59);
  if (local_59 == true) {
    tVar1 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    LOCK();
    (node->m_last_block_time)._M_i.__r = (rep)tVar1.__d.__r;
    UNLOCK();
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xe1e,false);
    CBlockHeader::GetHash
              (&local_48,
               &((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = 0;
    from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = extraout_RDX;
    RemoveBlockRequest(this,&local_48,from_peer);
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xe21,false);
    CBlockHeader::GetHash
              (&local_48,
               &((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
    ::erase(&(this->mapBlockSource)._M_t,&local_48);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessBlock(CNode& node, const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked)
{
    bool new_block{false};
    m_chainman.ProcessNewBlock(block, force_processing, min_pow_checked, &new_block);
    if (new_block) {
        node.m_last_block_time = GetTime<std::chrono::seconds>();
        // In case this block came from a different peer than we requested
        // from, we can erase the block request now anyway (as we just stored
        // this block to disk).
        LOCK(cs_main);
        RemoveBlockRequest(block->GetHash(), std::nullopt);
    } else {
        LOCK(cs_main);
        mapBlockSource.erase(block->GetHash());
    }
}